

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O3

int main(int argc,char **argv)

{
  sunrealtype (*pasVar1) [6];
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  WebData wdata;
  sunrealtype **ppsVar8;
  N_Vector p_Var9;
  void *pvVar10;
  WebData cB;
  sunrealtype (*pasVar11) [6];
  WebData wdata_00;
  int mxns;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  int iVar22;
  undefined1 auVar21 [16];
  int iVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  int iVar30;
  int indexB;
  int ncheck;
  sunrealtype t;
  int local_50;
  uint local_4c;
  long local_48;
  void *local_40;
  undefined1 local_38 [8];
  
  uVar7 = SUNContext_Create(0,&sunctx);
  if ((int)uVar7 < 0) {
    pcVar12 = "SUNContext_Create";
  }
  else {
    wdata = (WebData)malloc(0x9958);
    lVar18 = 4;
    do {
      ppsVar8 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
      wdata->P[lVar18 + -4] = ppsVar8;
      ppsVar8 = (sunrealtype **)SUNDlsMat_newIndexArray(6);
      wdata->P[lVar18] = ppsVar8;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 8);
    p_Var9 = (N_Vector)N_VNew_Serial(0x961,sunctx);
    wdata->rewt = p_Var9;
    p_Var9 = (N_Vector)N_VNew_Serial(0x961,sunctx);
    wdata->vtemp = p_Var9;
    p_Var9 = (N_Vector)N_VNew_Serial(0x960,sunctx);
    wdata->rewtB = p_Var9;
    p_Var9 = (N_Vector)N_VNew_Serial(0x960);
    wdata->vtempB = p_Var9;
    pasVar1 = wdata->acoef;
    wdata->ns = 6;
    lVar18 = 0;
    pasVar11 = pasVar1;
    do {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)*pasVar11 + lVar13) = 0;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0x120);
      lVar18 = lVar18 + 1;
      pasVar11 = (sunrealtype (*) [6])(*pasVar11 + 1);
    } while (lVar18 != 6);
    pasVar11 = wdata->acoef + 3;
    lVar18 = 0;
    do {
      lVar13 = -0x90;
      do {
        *(undefined8 *)((long)(pasVar11 + 3) + lVar13) = 0x40c3880000000000;
        *(undefined8 *)((long)*pasVar11 + lVar13 + 0x18) = 0xbea0c6f7a0b5ed8d;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0);
      *(undefined8 *)(lVar18 * 0x38 + (long)pasVar1) = 0xbff0000000000000;
      *(undefined8 *)((lVar18 + 3) * 0x38 + (long)pasVar1) = 0xbff0000000000000;
      wdata->bcoef[lVar18] = 1.0;
      wdata->bcoef[lVar18 + 3] = -1.0;
      wdata->diff[lVar18] = 1.0;
      wdata->diff[lVar18 + 3] = 0.5;
      lVar18 = lVar18 + 1;
      pasVar11 = (sunrealtype (*) [6])(*pasVar11 + 1);
    } while (lVar18 != 3);
    wdata->mxns = 0x78;
    wdata->dx = 0.05263157894736842;
    wdata->dy = 0.05263157894736842;
    auVar6 = _DAT_00105020;
    lVar18 = 0x50;
    do {
      auVar21 = divpd(*(undefined1 (*) [16])(wdata->P + lVar18),auVar6);
      *(undefined1 (*) [16])(wdata->pivot + lVar18 + 2) = auVar21;
      *(undefined1 (*) [16])(wdata->pivot + lVar18 + 8) = auVar21;
      lVar18 = lVar18 + 2;
    } while (lVar18 != 0x56);
    wdata->mp = 6;
    wdata->mq = 400;
    wdata->mx = 0x14;
    wdata->my = 0x14;
    wdata->srur = 1.4901161193847656e-08;
    wdata->ngrp = 4;
    wdata->ngx = 2;
    wdata->ngy = 2;
    wdata->mxmp = 0x78;
    wdata->jgx[0] = 0;
    wdata->jgx[1] = 10;
    wdata->jgx[2] = 0x14;
    wdata->jigx[0] = 0;
    wdata->jigx[1] = 0;
    wdata->jigx[2] = 0;
    wdata->jigx[3] = 0;
    wdata->jigx[4] = 0;
    wdata->jigx[5] = 0;
    wdata->jigx[6] = 0;
    wdata->jigx[7] = 0;
    wdata->jigx[8] = 0;
    auVar23 = _DAT_00105070;
    auVar21 = _DAT_00105060;
    auVar6 = _DAT_00105050;
    wdata->jigx[9] = 0;
    lVar18 = 0;
    iVar20 = (int)DAT_00105080;
    iVar22 = DAT_00105080._4_4_;
    do {
      auVar25._8_4_ = (int)lVar18;
      auVar25._0_8_ = lVar18;
      auVar25._12_4_ = (int)((ulong)lVar18 >> 0x20);
      auVar26 = (auVar25 | auVar21) ^ auVar23;
      if (auVar26._4_4_ == iVar22 && auVar26._0_4_ < iVar20) {
        wdata->jigx[lVar18 + 10] = 1;
        wdata->jigx[lVar18 + 0xb] = 1;
      }
      auVar25 = (auVar25 | auVar6) ^ auVar23;
      if (auVar25._4_4_ == iVar22 && auVar25._0_4_ < iVar20) {
        wdata->jigx[lVar18 + 0xc] = 1;
        wdata->jigx[lVar18 + 0xd] = 1;
      }
      lVar18 = lVar18 + 4;
    } while (lVar18 != 0xc);
    wdata->jxr[0] = 4;
    wdata->jxr[1] = 0xe;
    wdata->jgy[0] = 0;
    wdata->jgy[1] = 10;
    wdata->jgy[2] = 0x14;
    wdata->jigy[0] = 0;
    wdata->jigy[1] = 0;
    wdata->jigy[2] = 0;
    wdata->jigy[3] = 0;
    wdata->jigy[4] = 0;
    wdata->jigy[5] = 0;
    wdata->jigy[6] = 0;
    wdata->jigy[7] = 0;
    wdata->jigy[8] = 0;
    wdata->jigy[9] = 0;
    lVar18 = 0;
    do {
      auVar26._8_4_ = (int)lVar18;
      auVar26._0_8_ = lVar18;
      auVar26._12_4_ = (int)((ulong)lVar18 >> 0x20);
      auVar25 = (auVar26 | auVar21) ^ auVar23;
      if (auVar25._4_4_ == iVar22 && auVar25._0_4_ < iVar20) {
        wdata->jigy[lVar18 + 10] = 1;
        wdata->jigy[lVar18 + 0xb] = 1;
      }
      auVar25 = (auVar26 | auVar6) ^ auVar23;
      if (auVar25._4_4_ == iVar22 && auVar25._0_4_ < iVar20) {
        wdata->jigy[lVar18 + 0xc] = 1;
        wdata->jigy[lVar18 + 0xd] = 1;
      }
      lVar18 = lVar18 + 4;
    } while (lVar18 != 0xc);
    wdata->jyr[0] = 4;
    wdata->jyr[1] = 0xe;
    lVar18 = N_VNew_Serial(0x961,sunctx);
    if (lVar18 == 0) {
      main_cold_5();
      return 1;
    }
    lVar13 = N_VGetArrayPointer(lVar18);
    auVar21 = _DAT_00105070;
    auVar6 = _DAT_00105060;
    iVar20 = wdata->ns;
    iVar22 = wdata->mxns;
    dVar2 = wdata->dx;
    dVar3 = wdata->dy;
    lVar14 = (ulong)(iVar20 + 1U) - 2;
    auVar23._8_4_ = (int)lVar14;
    auVar23._0_8_ = lVar14;
    auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = lVar13 + 8;
    lVar15 = 0;
    auVar23 = auVar23 ^ _DAT_00105070;
    do {
      dVar27 = (double)(int)lVar15 * dVar3;
      dVar27 = dVar27 * 4.0 * (1.0 - dVar27);
      dVar27 = dVar27 * dVar27;
      lVar17 = 0;
      lVar16 = lVar14;
      do {
        dVar28 = (double)(int)lVar17 * dVar2;
        if (0 < iVar20) {
          dVar28 = dVar28 * 4.0 * (1.0 - dVar28);
          dVar28 = dVar28 * dVar28;
          uVar19 = 0;
          do {
            iVar5 = (int)uVar19;
            auVar29._8_4_ = iVar5;
            auVar29._0_8_ = uVar19;
            auVar29._12_4_ = (int)(uVar19 >> 0x20);
            auVar25 = (auVar29 | auVar6) ^ auVar21;
            bVar4 = auVar23._0_4_ < auVar25._0_4_;
            iVar24 = auVar23._4_4_;
            iVar30 = auVar25._4_4_;
            if ((bool)(~(iVar24 < iVar30 || iVar30 == iVar24 && bVar4) & 1)) {
              *(double *)(lVar16 + -8 + uVar19 * 8) = (double)(iVar5 + 1) * dVar28 * dVar27 + 10.0;
            }
            if (iVar24 >= iVar30 && (iVar30 != iVar24 || !bVar4)) {
              *(double *)(lVar16 + uVar19 * 8) = (double)(iVar5 + 2) * dVar28 * dVar27 + 10.0;
            }
            uVar19 = uVar19 + 2;
          } while ((iVar20 + 1U & 0xfffffffe) != uVar19);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + (long)iVar20 * 8;
      } while (lVar17 != 0x14);
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + (long)iVar22 * 8;
    } while (lVar15 != 0x14);
    *(undefined8 *)(lVar13 + 0x4b00) = 0;
    puts("\nCreate and allocate CVODES memory for forward run");
    pvVar10 = (void *)CVodeCreate(2,sunctx);
    local_40 = pvVar10;
    if (pvVar10 == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    wdata->cvode_mem = pvVar10;
    uVar7 = CVodeSetUserData(pvVar10,wdata);
    if ((int)uVar7 < 0) {
      pcVar12 = "CVodeSetUserData";
    }
    else {
      uVar7 = CVodeInit(0,pvVar10,f,lVar18);
      if ((int)uVar7 < 0) {
        pcVar12 = "CVodeInit";
      }
      else {
        uVar7 = CVodeSStolerances(0x3ee4f8b588e368f1,0x3ee4f8b588e368f1,pvVar10);
        if ((int)uVar7 < 0) {
          pcVar12 = "CVodeSStolerances";
        }
        else {
          lVar13 = SUNLinSol_SPGMR(lVar18,1,0,sunctx);
          if (lVar13 == 0) {
            main_cold_3();
            return 1;
          }
          uVar7 = CVodeSetLinearSolver(pvVar10,lVar13,0);
          if ((int)uVar7 < 0) {
            pcVar12 = "CVodeSetLinearSolver";
          }
          else {
            uVar7 = CVodeSetPreconditioner(pvVar10,Precond,PSolve);
            if ((int)uVar7 < 0) {
              pcVar12 = "CVodeSetPreconditioner";
            }
            else {
              uVar7 = CVodeSetMaxNumSteps(pvVar10,0x9c4);
              if (-1 < (int)uVar7) {
                puts("\nAllocate global memory");
                uVar7 = CVodeAdjInit(pvVar10,300,1);
                if ((int)uVar7 < 0) {
                  pcVar12 = "CVodeAdjInit";
                }
                else {
                  puts("\nForward integration");
                  uVar7 = CVodeF(0x4024000000000000,pvVar10,lVar18,local_38,1,&local_4c);
                  if (-1 < (int)uVar7) {
                    printf("\nncheck = %d\n",(ulong)local_4c);
                    lVar14 = N_VGetArrayPointer(lVar18);
                    printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %f \n\n",
                           *(undefined8 *)(lVar14 + 0x4b00),6);
                    cB = (WebData)N_VNew_Serial(0x960,sunctx);
                    if (cB == (WebData)0x0) {
                      main_cold_2();
                      return 1;
                    }
                    N_VConst(0,cB);
                    puts("\nCreate and allocate CVODES memory for backward run");
                    uVar7 = CVodeCreateB(pvVar10,2,&local_50);
                    if ((int)uVar7 < 0) {
                      pcVar12 = "CVodeCreateB";
                    }
                    else {
                      uVar7 = CVodeSetUserDataB(pvVar10,local_50,wdata);
                      if ((int)uVar7 < 0) {
                        pcVar12 = "CVodeSetUserDataB";
                      }
                      else {
                        uVar7 = CVodeSetMaxNumStepsB(pvVar10,local_50,1000);
                        if ((int)uVar7 < 0) {
                          pcVar12 = "CVodeSetMaxNumStepsB";
                        }
                        else {
                          uVar7 = CVodeInitB(0x4024000000000000,pvVar10,local_50,fB,cB);
                          if ((int)uVar7 < 0) {
                            pcVar12 = "CVodeInitB";
                          }
                          else {
                            uVar7 = CVodeSStolerancesB(0x3ee4f8b588e368f1,0x3ee4f8b588e368f1,pvVar10
                                                       ,local_50);
                            if ((int)uVar7 < 0) {
                              pcVar12 = "CVodeSStolerancesB";
                            }
                            else {
                              wdata->indexB = local_50;
                              local_48 = lVar13;
                              lVar13 = SUNLinSol_SPGMR(cB,1,0,sunctx);
                              if (lVar13 == 0) {
                                main_cold_1();
                                return 1;
                              }
                              uVar7 = CVodeSetLinearSolverB(pvVar10,local_50,lVar13,0);
                              if ((int)uVar7 < 0) {
                                pcVar12 = "CVodeSetLinearSolverB";
                              }
                              else {
                                uVar7 = CVodeSetPreconditionerB(pvVar10,local_50,PrecondB,PSolveB);
                                if ((int)uVar7 < 0) {
                                  pcVar12 = "CVodeSetPreconditionerB";
                                }
                                else {
                                  puts("\nBackward integration");
                                  uVar7 = CVodeB(0,pvVar10,1);
                                  if ((int)uVar7 < 0) {
                                    pcVar12 = "CVodeB";
                                    goto LAB_00102ff9;
                                  }
                                  wdata_00 = cB;
                                  uVar7 = CVodeGetB(pvVar10,local_50,local_38);
                                  if (-1 < (int)uVar7) {
                                    PrintOutput((N_Vector)cB,(int)wdata,mxns,wdata_00);
                                    CVodeFree(&local_40);
                                    N_VDestroy(lVar18);
                                    N_VDestroy(cB);
                                    SUNLinSolFree(local_48);
                                    SUNLinSolFree(lVar13);
                                    SUNContext_Free(&sunctx);
                                    FreeUserData(wdata);
                                    return 0;
                                  }
                                  pcVar12 = "CVodeGetB";
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0010301c;
                  }
                  pcVar12 = "CVodeF";
                }
LAB_00102ff9:
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar12,
                        (ulong)uVar7);
                return 1;
              }
              pcVar12 = "CVodeSetMaxNumSteps";
            }
          }
        }
      }
    }
  }
LAB_0010301c:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar12,(ulong)uVar7);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t;
  N_Vector c;
  WebData wdata;
  void* cvode_mem;
  SUNLinearSolver LS, LSB;

  int retval, ncheck;

  int indexB;

  sunrealtype reltolB = RTOL, abstolB = ATOL;
  N_Vector cB;

  c         = NULL;
  cB        = NULL;
  wdata     = NULL;
  cvode_mem = NULL;
  LS = LSB = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data */

  wdata = AllocUserData();
  if (check_retval((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);

  /* Set-up forward problem */

  /* Initializations */
  c = N_VNew_Serial(NEQ + 1, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }
  CInit(c, wdata);

  /* Call CVodeCreate/CVodeInit for forward run */
  printf("\nCreate and allocate CVODES memory for forward run\n");
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }
  wdata->cvode_mem = cvode_mem; /* Used in Precond */
  retval           = CVodeSetUserData(cvode_mem, wdata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }
  retval = CVodeInit(cvode_mem, f, T0, c);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create SUNLinSol_SPGMR linear solver for forward run */
  LS = SUNLinSol_SPGMR(c, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Set-up adjoint calculations */

  printf("\nAllocate global memory\n");
  retval = CVodeAdjInit(cvode_mem, NSTEPS, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */

  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, c, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %Lf \n\n", ISPEC,
         N_VGetArrayPointer(c)[NEQ]);
#else
  printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %f \n\n", ISPEC,
         N_VGetArrayPointer(c)[NEQ]);
#endif

  /* Set-up backward problem */

  /* Allocate cB */
  cB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)cB, "N_VNew_Serial", 0)) { return (1); }
  /* Initialize cB = 0 */
  N_VConst(ZERO, cB);

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }
  retval = CVodeSetUserDataB(cvode_mem, indexB, wdata);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }
  retval = CVodeSetMaxNumStepsB(cvode_mem, indexB, 1000);
  if (check_retval(&retval, "CVodeSetMaxNumStepsB", 1)) { return (1); }
  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, cB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  wdata->indexB = indexB;

  /* Create SUNLinSol_SPGMR linear solver for backward run */
  LSB = SUNLinSol_SPGMR(cB, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditionerB(cvode_mem, indexB, PrecondB, PSolveB);
  if (check_retval(&retval, "CVodeSetPreconditionerB", 1)) { return (1); }

  /* Perform backward integration */

  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, cB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(cB, NS, MXNS, wdata);

  /* Free all memory */
  CVodeFree(&cvode_mem);

  N_VDestroy(c);
  N_VDestroy(cB);
  SUNLinSolFree(LS);
  SUNLinSolFree(LSB);
  SUNContext_Free(&sunctx);
  FreeUserData(wdata);

  return (0);
}